

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O1

void __thiscall Analysis::FlowAnalysis_multistrange_particles(Analysis *this)

{
  pretty_ostream *this_00;
  pointer pcVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  singleParticleSpectra *psVar5;
  singleParticleSpectra **ipart;
  singleParticleSpectra **ppsVar6;
  ulong uVar7;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  singleParticleSpectra *local_470;
  singleParticleSpectra **local_468;
  iterator iStack_460;
  singleParticleSpectra **local_458;
  ParameterReader local_448;
  shared_ptr<particleSamples> local_418;
  shared_ptr<RandomUtil::Random> local_408;
  shared_ptr<RandomUtil::Random> local_3f8;
  shared_ptr<RandomUtil::Random> local_3e8;
  shared_ptr<RandomUtil::Random> local_3d8;
  shared_ptr<RandomUtil::Random> local_3c8;
  shared_ptr<RandomUtil::Random> local_3b8;
  shared_ptr<RandomUtil::Random> local_3a8;
  ulong local_398;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_448.names,&(this->paraRdr_).names);
  std::vector<double,_std::allocator<double>_>::vector(&local_448.values,&(this->paraRdr_).values);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"compute_correlation","");
  ParameterReader::setVal(&local_448,&local_50,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"flag_charge_dependence","");
  ParameterReader::setVal(&local_448,&local_70,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"rap_type","");
  ParameterReader::setVal(&local_448,&local_90,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rapidity_distribution","");
  ParameterReader::setVal(&local_448,&local_b0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"rapidityPTDistributionFlag","");
  ParameterReader::setVal(&local_448,&local_d0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"rap_min","");
  ParameterReader::setVal(&local_448,&local_f0,-0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"rap_max","");
  ParameterReader::setVal(&local_448,&local_110,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vn_rapidity_dis_pT_min","");
  ParameterReader::setVal(&local_448,&local_130,0.2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"vn_rapidity_dis_pT_max","");
  ParameterReader::setVal(&local_448,&local_150,3.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_468 = (singleParticleSpectra **)0x0;
  iStack_460._M_current = (singleParticleSpectra **)0x0;
  local_458 = (singleParticleSpectra **)0x0;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_170,3122.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_190,&local_3a8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_1b0,-3122.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_1d0,&local_3b8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_1f0,3312.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_210,&local_3c8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3c8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_230,-3312.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_250,&local_3d8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_270,3334.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_290,&local_3e8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_2b0,-3334.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_2d0,&local_3f8);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"particle_monval","");
  ParameterReader::setVal(&local_448,&local_2f0,333.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  psVar5 = (singleParticleSpectra *)operator_new(0x8b8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar1,pcVar1 + (this->path_)._M_string_length);
  local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  singleParticleSpectra::singleParticleSpectra(psVar5,&local_448,&local_310,&local_408);
  local_470 = psVar5;
  if (iStack_460._M_current == local_458) {
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    _M_realloc_insert<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_468,
               iStack_460,&local_470);
  }
  else {
    *iStack_460._M_current = psVar5;
    iStack_460._M_current = iStack_460._M_current + 1;
  }
  if (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  this_00 = &this->messager;
  uVar7 = 0;
  while( true ) {
    bVar3 = particleSamples::end_of_file
                      ((this->particle_list_).
                       super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar2._M_current = iStack_460._M_current;
    ppsVar6 = local_468;
    if (bVar3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Reading event: ",0xf);
    std::ostream::operator<<(this_00,(int)uVar7 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ... ",5);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"info","");
    pretty_ostream::flush(this_00,&local_350);
    local_398 = uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    iVar4 = particleSamples::read_in_particle_samples
                      ((this->particle_list_).
                       super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"nev = ",6);
    std::ostream::operator<<(this_00,iVar4);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"info","");
    pretty_ostream::flush(this_00,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330," processing ...","");
    pretty_ostream::info(this_00,&local_330);
    ppsVar6 = local_468;
    iVar2._M_current = iStack_460._M_current;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
      ppsVar6 = local_468;
      iVar2._M_current = iStack_460._M_current;
    }
    for (; ppsVar6 != iVar2._M_current; ppsVar6 = ppsVar6 + 1) {
      particleSamples::filter_particles_from_events
                ((this->particle_list_).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (*ppsVar6)->particle_monval);
      psVar5 = *ppsVar6;
      local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->particle_list_).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      singleParticleSpectra::calculate_Qn_vector_shell(psVar5,&local_418);
      if (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_418.super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"done!","");
    pretty_ostream::info(this_00,&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    uVar7 = (ulong)(uint)(iVar4 + (int)local_398);
  }
  for (; ppsVar6 != iVar2._M_current; ppsVar6 = ppsVar6 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar6);
  }
  if (iStack_460._M_current != local_468) {
    iStack_460._M_current = local_468;
  }
  if (local_468 != (singleParticleSpectra **)0x0) {
    operator_delete(local_468);
  }
  ParameterReader::~ParameterReader(&local_448);
  return;
}

Assistant:

void Analysis::FlowAnalysis_multistrange_particles() {
    ParameterReader paraRdr = paraRdr_;
    paraRdr.setVal("compute_correlation", 0);
    paraRdr.setVal("flag_charge_dependence", 0);
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;
    paraRdr.setVal("particle_monval", 3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3122);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3312);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -3334);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 333);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}